

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

symbol ** Symbol_arrayof(void)

{
  s_x2node *psVar1;
  s_x2 *psVar2;
  symbol **ppsVar3;
  long lVar4;
  size_t __nmemb;
  
  psVar2 = x2a;
  if (x2a == (s_x2 *)0x0) {
    ppsVar3 = (symbol **)0x0;
  }
  else {
    __nmemb = (size_t)x2a->count;
    ppsVar3 = (symbol **)calloc(__nmemb,8);
    if (ppsVar3 != (symbol **)0x0 && 0 < (long)__nmemb) {
      psVar1 = psVar2->tbl;
      lVar4 = 0;
      do {
        *(undefined8 *)((long)ppsVar3 + lVar4) = *(undefined8 *)((long)&psVar1->data + lVar4 * 4);
        lVar4 = lVar4 + 8;
      } while (__nmemb * 8 != lVar4);
    }
  }
  return ppsVar3;
}

Assistant:

struct symbol **Symbol_arrayof()
{
  struct symbol **array;
  int i,size;
  if( x2a==0 ) return 0;
  size = x2a->count;
  array = (struct symbol **)calloc(size, sizeof(struct symbol *));
  if( array ){
    for(i=0; i<size; i++) array[i] = x2a->tbl[i].data;
  }
  return array;
}